

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::sse42::InstanceArrayIntersector1MB::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  int iVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long *plVar8;
  long lVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  _func_int *p_Var16;
  undefined1 auVar17 [12];
  undefined1 in_XMM0 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar27;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar26 [16];
  undefined1 auVar28 [12];
  float fVar32;
  undefined1 in_XMM2 [16];
  undefined1 auVar29 [16];
  float fVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM3 [16];
  vfloat4 l02;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 in_XMM4 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar41;
  undefined1 auVar42 [16];
  undefined1 auVar44 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar53 [12];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar59;
  undefined1 in_XMM7 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar61;
  undefined1 auVar57 [16];
  float fVar60;
  undefined1 auVar58 [16];
  float fVar62;
  float fVar63;
  float fVar66;
  float fVar67;
  undefined1 in_XMM8 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar68;
  undefined1 in_XMM9 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 in_XMM10 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 in_XMM14 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  RayQueryContext newcontext;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  float local_118;
  float local_108;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar25 [16];
  
  auVar53 = in_XMM7._0_12_;
  auVar44 = in_XMM5._0_12_;
  uVar13 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var16 = *(_func_int **)&pGVar6->field_0x58;
  if ((((p_Var16 != (_func_int *)0x0) ||
       ((uVar11 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                                  (long)pGVar6[1].intersectionFilterN * (ulong)uVar13),
        uVar11 != 0xffffffff &&
        (p_Var16 = pGVar6[1].super_RefCount._vptr_RefCount[uVar11], p_Var16 != (_func_int *)0x0))))
      && (((ray->super_RayK<1>).mask & pGVar6->mask) != 0)) &&
     (pRVar7 = context->user, pRVar7->instID[0] == 0xffffffff)) {
    pRVar7->instID[0] = prim->instID_;
    pRVar7->instPrimID[0] = uVar13;
    uVar11 = (ulong)prim->primID_;
    if (pGVar6->numTimeSteps == 1) {
      plVar8 = *(long **)&pGVar6[1].fnumTimeSegments;
      iVar5 = (int)plVar8[4];
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        if (iVar5 == 0x9134) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x10 + lVar12),0x1c);
          in_XMM10 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
          in_XMM4 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
          in_XMM3 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                             *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
          in_XMM2 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
        }
        else if (iVar5 == 0x9234) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          uVar2 = *(undefined8 *)(lVar9 + 4 + lVar12);
          in_XMM10._4_4_ = (int)uVar2;
          in_XMM10._0_4_ = *(undefined4 *)(lVar9 + lVar12);
          in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM10._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
          in_XMM4._4_4_ = (int)uVar2;
          in_XMM4._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar12);
          in_XMM4._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
          in_XMM3._4_4_ = (int)uVar2;
          in_XMM3._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
          in_XMM3._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
          in_XMM2._4_4_ = (int)uVar2;
          in_XMM2._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar12);
          in_XMM2._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM2._12_4_ = 0;
        }
        else if (iVar5 == 0xb001) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
          auVar21 = insertps(auVar38,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
          auVar71._4_4_ = (int)uVar2;
          auVar71._0_4_ = *(undefined4 *)(lVar9 + lVar12);
          auVar71._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar71._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
          auVar31._4_4_ = (int)uVar2;
          auVar31._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
          auVar31._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar31._12_4_ = 0;
          fVar43 = *(float *)(lVar9 + 0x24 + lVar12);
          fVar23 = *(float *)(lVar9 + 0x28 + lVar12);
          fVar24 = *(float *)(lVar9 + 0x2c + lVar12);
          fVar27 = *(float *)(lVar9 + 0x30 + lVar12);
          fVar62 = fVar27 * fVar27 + fVar24 * fVar24 + fVar43 * fVar43 + fVar23 * fVar23;
          auVar87 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
          fVar49 = auVar87._0_4_;
          auVar57._4_12_ = auVar87._4_12_;
          fVar49 = fVar49 * fVar49 * fVar62 * -0.5 * fVar49 + fVar49 * 1.5;
          in_XMM2 = insertps(auVar31,ZEXT416((uint)(fVar43 * fVar49)),0x30);
          in_XMM10 = insertps(auVar71,ZEXT416((uint)(fVar23 * fVar49)),0x30);
          auVar57._0_4_ = fVar49 * fVar27;
          auVar87 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                             *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
          in_XMM3 = insertps(auVar21,auVar57,0x30);
          auVar21 = insertps(auVar87,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
          in_XMM4 = insertps(auVar21,ZEXT416((uint)(fVar24 * fVar49)),0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          in_XMM10 = *(undefined1 (*) [16])(lVar9 + lVar12);
          in_XMM4 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
          in_XMM3 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
          in_XMM2 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar12);
        }
        fVar62 = in_XMM2._8_4_;
        fVar43 = in_XMM2._12_4_;
        fVar33 = in_XMM10._12_4_;
        fVar32 = in_XMM4._4_4_;
        fVar27 = in_XMM4._12_4_;
        fVar77 = in_XMM3._8_4_;
        fVar24 = in_XMM3._12_4_;
        fVar70 = fVar33 * fVar27 + fVar24 * fVar43;
        fVar49 = fVar33 * fVar27 - fVar24 * fVar43;
        fVar51 = fVar43 * fVar43 + fVar33 * fVar33 + -fVar27 * fVar27 + -fVar24 * fVar24;
        fVar78 = fVar43 * fVar43 - fVar33 * fVar33;
        fVar68 = fVar27 * fVar27 + fVar78 + -fVar24 * fVar24;
        fVar59 = fVar33 * fVar24 - fVar27 * fVar43;
        fVar23 = fVar27 * fVar43 + fVar33 * fVar24;
        fVar61 = fVar27 * fVar24 + fVar33 * fVar43;
        fVar43 = fVar27 * fVar24 - fVar33 * fVar43;
        fVar70 = fVar70 + fVar70;
        fVar59 = fVar59 + fVar59;
        fVar63 = in_XMM10._0_4_;
        fVar33 = fVar24 * fVar24 + fVar78 + -fVar27 * fVar27;
        fVar52 = fVar51 * 1.0 + fVar70 * 0.0 + fVar59 * 0.0;
        fVar60 = fVar51 * 0.0 + fVar70 * 1.0 + fVar59 * 0.0;
        fVar50 = fVar51 * 0.0 + fVar70 * 0.0 + fVar59 * 1.0;
        fVar59 = fVar51 * 0.0 + fVar70 * 0.0 + fVar59 * 0.0;
        fVar61 = fVar61 + fVar61;
        fVar49 = fVar49 + fVar49;
        fVar51 = fVar49 * 1.0 + fVar68 * 0.0 + fVar61 * 0.0;
        fVar70 = fVar49 * 0.0 + fVar68 * 1.0 + fVar61 * 0.0;
        fVar78 = fVar49 * 0.0 + fVar68 * 0.0 + fVar61 * 1.0;
        fVar68 = fVar49 * 0.0 + fVar68 * 0.0 + fVar61 * 0.0;
        auVar64._0_8_ = in_XMM10._4_8_;
        auVar64._8_8_ = 0;
        auVar21 = blendps(auVar64,in_XMM4,4);
        fVar23 = fVar23 + fVar23;
        fVar43 = fVar43 + fVar43;
        fVar24 = fVar23 * 1.0 + fVar43 * 0.0 + fVar33 * 0.0;
        fVar27 = fVar23 * 0.0 + fVar43 * 1.0 + fVar33 * 0.0;
        fVar49 = fVar23 * 0.0 + fVar43 * 0.0 + fVar33 * 1.0;
        fVar23 = fVar23 * 0.0 + fVar43 * 0.0 + fVar33 * 0.0;
        fVar33 = fVar23 * 0.0;
        in_XMM14._0_4_ = fVar63 * fVar52 + fVar51 * 0.0 + fVar24 * 0.0;
        in_XMM14._4_4_ = fVar63 * fVar60 + fVar70 * 0.0 + fVar27 * 0.0;
        in_XMM14._8_4_ = fVar63 * fVar50 + fVar78 * 0.0 + fVar49 * 0.0;
        in_XMM14._12_4_ = fVar63 * fVar59 + fVar68 * 0.0 + fVar33;
        fVar43 = in_XMM4._0_4_;
        in_XMM1._0_4_ = fVar43 * fVar52 + fVar32 * fVar51 + fVar24 * 0.0;
        in_XMM1._4_4_ = fVar43 * fVar60 + fVar32 * fVar70 + fVar27 * 0.0;
        in_XMM1._8_4_ = fVar43 * fVar50 + fVar32 * fVar78 + fVar49 * 0.0;
        in_XMM1._12_4_ = fVar43 * fVar59 + fVar32 * fVar68 + fVar33;
        fVar32 = in_XMM3._4_4_;
        fVar43 = in_XMM3._0_4_;
        in_XMM0._0_4_ = fVar43 * fVar52 + fVar32 * fVar51 + fVar77 * fVar24;
        in_XMM0._4_4_ = fVar43 * fVar60 + fVar32 * fVar70 + fVar77 * fVar27;
        in_XMM0._8_4_ = fVar43 * fVar50 + fVar32 * fVar78 + fVar77 * fVar49;
        in_XMM0._12_4_ = fVar43 * fVar59 + fVar32 * fVar68 + fVar77 * fVar23;
        fVar23 = in_XMM2._4_4_;
        fVar43 = in_XMM2._0_4_;
        auVar44._0_4_ = fVar43 * fVar52 + fVar23 * fVar51 + fVar62 * fVar24 + auVar21._0_4_ + 0.0;
        auVar44._4_4_ = fVar43 * fVar60 + fVar23 * fVar70 + fVar62 * fVar27 + auVar21._4_4_ + 0.0;
        auVar44._8_4_ = fVar43 * fVar50 + fVar23 * fVar78 + fVar62 * fVar49 + auVar21._8_4_ + 0.0;
      }
      else if (iVar5 == 0x9134) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),*(undefined4 *)(lVar9 + 0x10 + lVar12)
                           ,0x1c);
        in_XMM14 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
        auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                           *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
        in_XMM1 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
        auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                           *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
        in_XMM0 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
        auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                           *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
        auVar21 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
        auVar44 = auVar21._0_12_;
      }
      else if (iVar5 == 0x9234) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        uVar2 = *(undefined8 *)(lVar9 + 4 + lVar12);
        in_XMM14._4_4_ = (float)(int)uVar2;
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar9 + lVar12);
        in_XMM14._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM14._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
        in_XMM1._4_4_ = (float)(int)uVar2;
        in_XMM1._0_4_ = (float)*(undefined4 *)(lVar9 + 0xc + lVar12);
        in_XMM1._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM1._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
        in_XMM0._4_4_ = (float)(int)uVar2;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar9 + 0x18 + lVar12);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
        auVar44._4_4_ = (float)(int)uVar2;
        auVar44._0_4_ = (float)*(undefined4 *)(lVar9 + 0x24 + lVar12);
        auVar44._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
      }
      else if (iVar5 == 0xb001) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
        auVar21 = insertps(auVar18,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
        uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
        auVar85._4_4_ = (int)uVar2;
        auVar85._0_4_ = *(undefined4 *)(lVar9 + lVar12);
        auVar85._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar85._12_4_ = 0;
        uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
        auVar45._4_4_ = (int)uVar2;
        auVar45._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
        auVar45._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar45._12_4_ = 0;
        fVar43 = *(float *)(lVar9 + 0x24 + lVar12);
        fVar23 = *(float *)(lVar9 + 0x28 + lVar12);
        fVar24 = *(float *)(lVar9 + 0x2c + lVar12);
        fVar27 = *(float *)(lVar9 + 0x30 + lVar12);
        fVar62 = fVar27 * fVar27 + fVar24 * fVar24 + fVar43 * fVar43 + fVar23 * fVar23;
        auVar87 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
        fVar49 = auVar87._0_4_;
        auVar54._4_12_ = auVar87._4_12_;
        fVar49 = fVar49 * fVar49 * fVar62 * -0.5 * fVar49 + fVar49 * 1.5;
        auVar87 = insertps(auVar45,ZEXT416((uint)(fVar43 * fVar49)),0x30);
        auVar44 = auVar87._0_12_;
        in_XMM14 = insertps(auVar85,ZEXT416((uint)(fVar23 * fVar49)),0x30);
        auVar54._0_4_ = fVar49 * fVar27;
        auVar87 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                           *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
        in_XMM0 = insertps(auVar21,auVar54,0x30);
        auVar21 = insertps(auVar87,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
        in_XMM1 = insertps(auVar21,ZEXT416((uint)(fVar24 * fVar49)),0x30);
      }
      else if (iVar5 == 0x9244) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        in_XMM14 = *(undefined1 (*) [16])(lVar9 + lVar12);
        in_XMM1 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
        in_XMM0 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
        auVar44 = SUB1612(*(undefined1 (*) [16])(lVar9 + 0x30 + lVar12),0);
      }
    }
    else {
      fVar43 = (pGVar6->time_range).lower;
      auVar28._0_4_ = (pGVar6->time_range).upper - fVar43;
      auVar28._4_8_ = 0;
      fVar23 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar43) / auVar28._0_4_) *
               pGVar6->fnumTimeSegments;
      auVar21 = roundss(ZEXT416((uint)fVar43),ZEXT416((uint)fVar23),9);
      fVar43 = pGVar6->fnumTimeSegments + -1.0;
      if (fVar43 <= auVar21._0_4_) {
        auVar21._0_4_ = fVar43;
      }
      auVar17 = ZEXT812(0);
      if (0.0 <= auVar21._0_4_) {
        auVar17._4_8_ = 0;
        auVar17._0_4_ = auVar21._0_4_;
      }
      auVar87._12_4_ = 0;
      auVar87._0_12_ = auVar17;
      uVar13 = (uint)auVar17._0_4_;
      fVar23 = fVar23 - auVar17._0_4_;
      lVar9 = *(long *)&pGVar6[1].fnumTimeSegments;
      plVar8 = (long *)(lVar9 + (ulong)uVar13 * 0x38);
      iVar5 = *(int *)(lVar9 + 0x20 + (ulong)uVar13 * 0x38);
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        if (iVar5 == 0x9134) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + lVar15)),
                             *(undefined4 *)(lVar12 + 0x10 + lVar15),0x1c);
          _local_158 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x20 + lVar15),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + 4 + lVar15)),
                             *(undefined4 *)(lVar12 + 0x14 + lVar15),0x1c);
          _local_128 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x24 + lVar15),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + 8 + lVar15)),
                             *(undefined4 *)(lVar12 + 0x18 + lVar15),0x1c);
          _local_168 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x28 + lVar15),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                             *(undefined4 *)(lVar12 + 0x1c + lVar15),0x1c);
          _local_138 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x2c + lVar15),0x28);
        }
        else if (iVar5 == 0x9234) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          uVar2 = *(undefined8 *)(lVar12 + 4 + lVar15);
          local_158._4_4_ = (int)uVar2;
          local_158._0_4_ = *(undefined4 *)(lVar12 + lVar15);
          fStack_150 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_14c = 0.0;
          uVar2 = *(undefined8 *)(lVar12 + 0x10 + lVar15);
          local_128._4_4_ = (int)uVar2;
          local_128._0_4_ = *(undefined4 *)(lVar12 + 0xc + lVar15);
          fStack_120 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_11c = 0.0;
          uVar2 = *(undefined8 *)(lVar12 + 0x1c + lVar15);
          local_168._4_4_ = (int)uVar2;
          local_168._0_4_ = *(undefined4 *)(lVar12 + 0x18 + lVar15);
          fStack_160 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_15c = 0.0;
          uVar2 = *(undefined8 *)(lVar12 + 0x28 + lVar15);
          local_138._4_4_ = (int)uVar2;
          local_138._0_4_ = *(undefined4 *)(lVar12 + 0x24 + lVar15);
          fStack_130 = (float)(int)((ulong)uVar2 >> 0x20);
          fStack_12c = 0.0;
        }
        else if (iVar5 == 0xb001) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          auVar69._8_8_ = 0;
          auVar69._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar15);
          auVar87 = insertps(auVar69,*(undefined4 *)(lVar12 + 8 + lVar15),0x20);
          uVar2 = *(undefined8 *)(lVar12 + 0x34 + lVar15);
          auVar75._4_4_ = (int)uVar2;
          auVar75._0_4_ = *(undefined4 *)(lVar12 + lVar15);
          auVar75._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar75._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar12 + 0x1c + lVar15);
          auVar72._4_4_ = (int)uVar2;
          auVar72._0_4_ = *(undefined4 *)(lVar12 + 0x18 + lVar15);
          auVar72._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar72._12_4_ = 0;
          fVar43 = *(float *)(lVar12 + 0x24 + lVar15);
          fVar24 = *(float *)(lVar12 + 0x28 + lVar15);
          fVar27 = *(float *)(lVar12 + 0x2c + lVar15);
          fVar49 = *(float *)(lVar12 + 0x30 + lVar15);
          fVar77 = fVar49 * fVar49 + fVar27 * fVar27 + fVar43 * fVar43 + fVar24 * fVar24;
          auVar21 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar62 = auVar21._0_4_;
          auVar37._4_12_ = auVar21._4_12_;
          fVar62 = fVar62 * fVar62 * fVar77 * -0.5 * fVar62 + fVar62 * 1.5;
          in_XMM10 = insertps(auVar72,ZEXT416((uint)(fVar43 * fVar62)),0x30);
          in_XMM7 = insertps(auVar75,ZEXT416((uint)(fVar24 * fVar62)),0x30);
          auVar37._0_4_ = fVar62 * fVar49;
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                             *(undefined4 *)(lVar12 + 4 + lVar15),0x10);
          in_XMM9 = insertps(auVar87,auVar37,0x30);
          auVar21 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x3c + lVar15),0x20);
          in_XMM8 = insertps(auVar21,ZEXT416((uint)(fVar27 * fVar62)),0x30);
          _local_168 = in_XMM9;
          _local_158 = in_XMM7;
          _local_138 = in_XMM10;
          _local_128 = in_XMM8;
        }
        else if (iVar5 == 0x9244) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          _local_158 = *(undefined1 (*) [16])(lVar12 + lVar15);
          _local_128 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar15);
          _local_168 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar15);
          _local_138 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar15);
        }
        lVar12 = (ulong)(uVar13 + 1) * 0x38;
        plVar8 = (long *)(lVar9 + lVar12);
        iVar5 = *(int *)(lVar9 + 0x20 + lVar12);
        if (iVar5 == 0x9134) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x10 + lVar12),0x1c);
          in_XMM7 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
          in_XMM9 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
          in_XMM8 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                             *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
          in_XMM10 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
        }
        else if (iVar5 == 0x9234) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          uVar2 = *(undefined8 *)(lVar9 + 4 + lVar12);
          in_XMM7._4_4_ = (int)uVar2;
          in_XMM7._0_4_ = *(undefined4 *)(lVar9 + lVar12);
          in_XMM7._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM7._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
          in_XMM9._4_4_ = (int)uVar2;
          in_XMM9._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar12);
          in_XMM9._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM9._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
          in_XMM8._4_4_ = (int)uVar2;
          in_XMM8._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
          in_XMM8._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM8._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
          in_XMM10._4_4_ = (int)uVar2;
          in_XMM10._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar12);
          in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM10._12_4_ = 0;
        }
        else if (iVar5 == 0xb001) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
          auVar87 = insertps(auVar65,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
          auVar58._4_4_ = (int)uVar2;
          auVar58._0_4_ = *(undefined4 *)(lVar9 + lVar12);
          auVar58._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar58._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
          auVar73._4_4_ = (int)uVar2;
          auVar73._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
          auVar73._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar73._12_4_ = 0;
          fVar43 = *(float *)(lVar9 + 0x24 + lVar12);
          fVar24 = *(float *)(lVar9 + 0x28 + lVar12);
          fVar27 = *(float *)(lVar9 + 0x2c + lVar12);
          fVar49 = *(float *)(lVar9 + 0x30 + lVar12);
          fVar77 = fVar49 * fVar49 + fVar27 * fVar27 + fVar43 * fVar43 + fVar24 * fVar24;
          auVar21 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar62 = auVar21._0_4_;
          auVar42._4_12_ = auVar21._4_12_;
          fVar62 = fVar62 * fVar62 * fVar77 * -0.5 * fVar62 + fVar62 * 1.5;
          in_XMM10 = insertps(auVar73,ZEXT416((uint)(fVar43 * fVar62)),0x30);
          in_XMM7 = insertps(auVar58,ZEXT416((uint)(fVar24 * fVar62)),0x30);
          auVar42._0_4_ = fVar62 * fVar49;
          auVar21 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                             *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
          in_XMM8 = insertps(auVar87,auVar42,0x30);
          auVar21 = insertps(auVar21,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
          in_XMM9 = insertps(auVar21,ZEXT416((uint)(fVar27 * fVar62)),0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          in_XMM7 = *(undefined1 (*) [16])(lVar9 + lVar12);
          in_XMM9 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
          in_XMM8 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
          in_XMM10 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar12);
        }
        local_118 = in_XMM10._12_4_;
        local_108 = in_XMM7._12_4_;
        fVar49 = in_XMM9._12_4_;
        fVar27 = in_XMM8._12_4_;
        fVar24 = fStack_15c * fVar27 +
                 fStack_11c * fVar49 + fStack_12c * local_118 + fStack_14c * local_108;
        fVar43 = -fVar24;
        if (fVar24 < fVar43) {
          local_118 = -local_118;
          local_108 = -local_108;
        }
        fVar77 = fVar43;
        fVar62 = -fVar27;
        if (fVar43 <= fVar24) {
          fVar77 = fVar24;
          fVar62 = fVar27;
        }
        fVar32 = ABS(fVar24);
        fVar27 = 1.0 - fVar32;
        if (fVar27 < 0.0) {
          fVar27 = sqrtf(fVar27);
        }
        else {
          fVar27 = SQRT(fVar27);
        }
        fVar33 = 1.5707964 -
                 fVar27 * (((((fVar32 * -0.0043095737 + 0.0192803) * fVar32 + -0.04489909) * fVar32
                            + 0.08785567) * fVar32 + -0.21450998) * fVar32 + 1.5707952);
        fVar27 = 0.0;
        if (0.0 <= fVar33) {
          fVar27 = fVar33;
        }
        fVar27 = (float)(-(uint)(1.0 < fVar32) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar32) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar27 & -(uint)(fVar77 < 0.0) |
                                     ~-(uint)(fVar77 < 0.0) & (uint)fVar27))) * fVar23;
        auVar21 = ZEXT416((uint)(fVar27 * 0.63661975));
        auVar21 = roundss(auVar21,auVar21,9);
        uVar14 = (uint)auVar21._0_4_;
        fVar27 = fVar27 - auVar21._0_4_ * 1.5707964;
        fVar32 = fVar27 * fVar27;
        local_178._0_4_ =
             (float)(~-(uint)(fVar24 < fVar43) & (uint)fVar49 |
                    (uint)-fVar49 & -(uint)(fVar24 < fVar43));
        uVar13 = uVar14 & 3;
        fVar24 = ((((fVar32 * -2.5963018e-07 + 2.4756235e-05) * fVar32 + -0.001388833) * fVar32 +
                  0.04166664) * fVar32 + -0.5) * fVar32 + 1.0;
        fVar27 = (((((fVar32 * -2.5029328e-08 + 2.7600126e-06) * fVar32 + -0.00019842605) * fVar32 +
                   0.008333348) * fVar32 + -0.16666667) * fVar32 + 1.0) * fVar27;
        fVar43 = fVar24;
        if ((uVar14 & 1) != 0) {
          fVar43 = fVar27;
          fVar27 = fVar24;
        }
        if (uVar13 - 1 < 2) {
          fVar43 = -fVar43;
        }
        fVar51 = fVar77 * fStack_12c - local_118;
        fVar33 = fVar77 * fStack_14c - local_108;
        fVar32 = fVar77 * fStack_11c - (float)local_178;
        fVar24 = fVar77 * fStack_15c - fVar62;
        auVar46._0_8_ = CONCAT44(fStack_15c,fVar24) ^ 0x8000000000000000;
        auVar46._8_4_ = -fStack_15c;
        auVar46._12_4_ = -fStack_15c;
        auVar47._4_12_ = auVar46._4_12_;
        auVar47._0_4_ = fVar24 * fVar24 + fVar32 * fVar32 + fVar51 * fVar51 + fVar33 * fVar33;
        auVar74._0_8_ = CONCAT44(fStack_15c,auVar47._0_4_) ^ 0x8000000000000000;
        auVar74._8_4_ = -fStack_15c;
        auVar74._12_4_ = -fStack_15c;
        auVar21 = rsqrtss(auVar74,auVar47);
        fVar70 = auVar21._0_4_;
        fVar70 = fVar70 * fVar70 * auVar47._0_4_ * -0.5 * fVar70 + fVar70 * 1.5;
        if (uVar13 < 2) {
          fVar27 = -fVar27;
        }
        fVar60 = 1.0 - fVar23;
        fVar52 = fVar60 * fStack_12c + local_118 * fVar23;
        fVar68 = fVar60 * fStack_14c + local_108 * fVar23;
        fVar78 = fVar60 * fStack_11c + (float)local_178 * fVar23;
        fVar59 = fStack_15c * fVar60 + fVar62 * fVar23;
        fVar50 = fVar59 * fVar59 + fVar78 * fVar78 + fVar52 * fVar52 + fVar68 * fVar68;
        auVar80._4_4_ = fStack_15c;
        auVar80._0_4_ = fVar50;
        auVar80._8_4_ = fStack_15c;
        auVar80._12_4_ = fStack_15c;
        auVar21 = rsqrtss(auVar80,auVar80);
        fVar62 = auVar21._0_4_;
        fVar62 = fVar62 * fVar62 * fVar50 * -0.5 * fVar62 + fVar62 * 1.5;
        if (0.9995 < fVar77) {
          fVar52 = fVar52 * fVar62;
          fVar68 = fVar68 * fVar62;
          fVar78 = fVar78 * fVar62;
        }
        else {
          fVar52 = fStack_12c * fVar43 + fVar51 * fVar70 * fVar27;
          fVar68 = fStack_14c * fVar43 + fVar33 * fVar70 * fVar27;
          fVar78 = fStack_11c * fVar43 + fVar32 * fVar70 * fVar27;
        }
        fVar27 = (float)(-(uint)(0.9995 < fVar77) & (uint)(fVar59 * fVar62) |
                        ~-(uint)(0.9995 < fVar77) &
                        (uint)(fVar43 * fStack_15c + fVar24 * fVar70 * fVar27));
        local_48 = in_XMM7._0_4_;
        fStack_44 = in_XMM7._4_4_;
        fStack_40 = in_XMM7._8_4_;
        fVar84 = (float)local_158._0_4_ * fVar60 + local_48 * fVar23;
        local_68 = in_XMM9._0_4_;
        fStack_64 = in_XMM9._4_4_;
        fStack_60 = in_XMM9._8_4_;
        fVar89 = (float)local_128._0_4_ * fVar60 + local_68 * fVar23;
        fVar90 = (float)local_128._4_4_ * fVar60 + fStack_64 * fVar23;
        local_58 = in_XMM8._0_4_;
        fStack_54 = in_XMM8._4_4_;
        fStack_50 = in_XMM8._8_4_;
        fVar70 = (float)local_168._0_4_ * fVar60 + local_58 * fVar23;
        fVar59 = (float)local_168._4_4_ * fVar60 + fStack_54 * fVar23;
        fVar61 = fStack_160 * fVar60 + fStack_50 * fVar23;
        local_78 = in_XMM10._0_4_;
        fStack_74 = in_XMM10._4_4_;
        fStack_70 = in_XMM10._8_4_;
        fVar81 = fVar60 * (float)local_138._0_4_ + fVar23 * local_78;
        fVar82 = fVar60 * (float)local_138._4_4_ + fVar23 * fStack_74;
        fVar83 = fVar60 * fStack_130 + fVar23 * fStack_70;
        fVar77 = fVar52 * fVar52 + fVar68 * fVar68 + -fVar78 * fVar78 + -fVar27 * fVar27;
        fVar66 = fVar68 * fVar78 + fVar52 * fVar27;
        fVar50 = fVar68 * fVar78 - fVar52 * fVar27;
        fVar62 = fVar52 * fVar52 - fVar68 * fVar68;
        fVar67 = fVar78 * fVar78 + fVar62 + -fVar27 * fVar27;
        fVar79 = fVar68 * fVar27 - fVar52 * fVar78;
        fVar24 = fVar52 * fVar78 + fVar68 * fVar27;
        fVar63 = fVar78 * fVar27 + fVar52 * fVar68;
        fVar43 = fVar78 * fVar27 - fVar52 * fVar68;
        fVar66 = fVar66 + fVar66;
        fVar79 = fVar79 + fVar79;
        fVar62 = fVar27 * fVar27 + fVar62 + -fVar78 * fVar78;
        fVar32 = fVar77 * 1.0 + fVar66 * 0.0 + fVar79 * 0.0;
        fVar33 = fVar77 * 0.0 + fVar66 * 1.0 + fVar79 * 0.0;
        fVar51 = fVar77 * 0.0 + fVar66 * 0.0 + fVar79 * 1.0;
        fVar77 = fVar77 * 0.0 + fVar66 * 0.0 + fVar79 * 0.0;
        fVar63 = fVar63 + fVar63;
        fVar50 = fVar50 + fVar50;
        fVar78 = fVar50 * 1.0 + fVar67 * 0.0 + fVar63 * 0.0;
        fVar68 = fVar50 * 0.0 + fVar67 * 1.0 + fVar63 * 0.0;
        fVar52 = fVar50 * 0.0 + fVar67 * 0.0 + fVar63 * 1.0;
        fVar50 = fVar50 * 0.0 + fVar67 * 0.0 + fVar63 * 0.0;
        auVar48._4_4_ = fStack_150 * fVar60 + fStack_40 * fVar23;
        auVar48._0_4_ = (float)local_158._4_4_ * fVar60 + fStack_44 * fVar23;
        auVar48._8_8_ = 0;
        auVar10._4_4_ = fVar90;
        auVar10._0_4_ = fVar89;
        auVar10._8_4_ = fStack_120 * fVar60 + fStack_60 * fVar23;
        auVar10._12_4_ = fStack_11c * fVar60 + fVar49 * fVar23;
        auVar21 = blendps(auVar48,auVar10,4);
        fVar24 = fVar24 + fVar24;
        fVar43 = fVar43 + fVar43;
        fVar23 = fVar24 * 1.0 + fVar43 * 0.0 + fVar62 * 0.0;
        fVar27 = fVar24 * 0.0 + fVar43 * 1.0 + fVar62 * 0.0;
        fVar49 = fVar24 * 0.0 + fVar43 * 0.0 + fVar62 * 1.0;
        fVar43 = fVar24 * 0.0 + fVar43 * 0.0 + fVar62 * 0.0;
        fVar24 = fVar43 * 0.0;
        in_XMM14._0_4_ = fVar84 * fVar32 + fVar78 * 0.0 + fVar23 * 0.0;
        in_XMM14._4_4_ = fVar84 * fVar33 + fVar68 * 0.0 + fVar27 * 0.0;
        in_XMM14._8_4_ = fVar84 * fVar51 + fVar52 * 0.0 + fVar49 * 0.0;
        in_XMM14._12_4_ = fVar84 * fVar77 + fVar50 * 0.0 + fVar24;
        in_XMM1._0_4_ = fVar89 * fVar32 + fVar90 * fVar78 + fVar23 * 0.0;
        in_XMM1._4_4_ = fVar89 * fVar33 + fVar90 * fVar68 + fVar27 * 0.0;
        in_XMM1._8_4_ = fVar89 * fVar51 + fVar90 * fVar52 + fVar49 * 0.0;
        in_XMM1._12_4_ = fVar89 * fVar77 + fVar90 * fVar50 + fVar24;
        in_XMM0._0_4_ = fVar70 * fVar32 + fVar59 * fVar78 + fVar61 * fVar23;
        in_XMM0._4_4_ = fVar70 * fVar33 + fVar59 * fVar68 + fVar61 * fVar27;
        in_XMM0._8_4_ = fVar70 * fVar51 + fVar59 * fVar52 + fVar61 * fVar49;
        in_XMM0._12_4_ = fVar70 * fVar77 + fVar59 * fVar50 + fVar61 * fVar43;
        auVar44._0_4_ = fVar81 * fVar32 + fVar82 * fVar78 + fVar83 * fVar23 + auVar21._0_4_ + 0.0;
        auVar44._4_4_ = fVar81 * fVar33 + fVar82 * fVar68 + fVar83 * fVar27 + auVar21._4_4_ + 0.0;
        auVar44._8_4_ = fVar81 * fVar51 + fVar82 * fVar52 + fVar83 * fVar49 + auVar21._8_4_ + 0.0;
      }
      else {
        if (iVar5 == 0x9134) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + lVar15)),
                             *(undefined4 *)(lVar12 + 0x10 + lVar15),0x1c);
          in_XMM14 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x20 + lVar15),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(lVar12 + 4 + lVar15)),
                             *(undefined4 *)(lVar12 + 0x14 + lVar15),0x1c);
          auVar21 = insertps(auVar21,*(undefined4 *)(lVar12 + 0x24 + lVar15),0x28);
          auVar87 = insertps(ZEXT416(*(uint *)(lVar12 + 8 + lVar15)),
                             *(undefined4 *)(lVar12 + 0x18 + lVar15),0x1c);
          auVar87 = insertps(auVar87,*(undefined4 *)(lVar12 + 0x28 + lVar15),0x28);
          auVar37 = insertps(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                             *(undefined4 *)(lVar12 + 0x1c + lVar15),0x1c);
          auVar37 = insertps(auVar37,*(undefined4 *)(lVar12 + 0x2c + lVar15),0x28);
          auVar28 = auVar37._0_12_;
        }
        else if (iVar5 == 0x9234) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          uVar2 = *(undefined8 *)(lVar12 + 4 + lVar15);
          in_XMM14._4_4_ = (float)(int)uVar2;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar12 + lVar15);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar12 + 0x10 + lVar15);
          auVar21._4_4_ = (int)uVar2;
          auVar21._0_4_ = *(undefined4 *)(lVar12 + 0xc + lVar15);
          auVar21._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar21._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar12 + 0x1c + lVar15);
          auVar87._4_4_ = (int)uVar2;
          auVar87._0_4_ = *(undefined4 *)(lVar12 + 0x18 + lVar15);
          auVar87._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar87._12_4_ = 0;
          uVar1 = *(ulong *)(lVar12 + 0x28 + lVar15);
          in_XMM3._8_8_ = 0;
          in_XMM3._0_8_ = uVar1;
          auVar28._4_4_ = (int)uVar1;
          auVar28._0_4_ = (float)*(undefined4 *)(lVar12 + 0x24 + lVar15);
          auVar28._8_4_ = (int)(uVar1 >> 0x20);
        }
        else if (iVar5 == 0xb001) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar15);
          auVar21 = insertps(auVar19,*(undefined4 *)(lVar12 + 8 + lVar15),0x20);
          uVar2 = *(undefined8 *)(lVar12 + 0x34 + lVar15);
          auVar86._4_4_ = (int)uVar2;
          auVar86._0_4_ = *(undefined4 *)(lVar12 + lVar15);
          auVar86._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar86._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar12 + 0x1c + lVar15);
          auVar29._4_4_ = (int)uVar2;
          auVar29._0_4_ = *(undefined4 *)(lVar12 + 0x18 + lVar15);
          auVar29._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar29._12_4_ = 0;
          fVar43 = *(float *)(lVar12 + 0x24 + lVar15);
          fVar24 = *(float *)(lVar12 + 0x28 + lVar15);
          fVar27 = *(float *)(lVar12 + 0x2c + lVar15);
          fVar49 = *(float *)(lVar12 + 0x30 + lVar15);
          in_XMM4 = ZEXT416((uint)fVar49);
          fVar77 = fVar49 * fVar49 + fVar27 * fVar27 + fVar43 * fVar43 + fVar24 * fVar24;
          auVar87 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar62 = auVar87._0_4_;
          auVar55._4_12_ = auVar87._4_12_;
          fVar62 = fVar62 * fVar62 * fVar77 * -0.5 * fVar62 + fVar62 * 1.5;
          in_XMM6 = ZEXT416((uint)(fVar43 * fVar62));
          auVar87 = insertps(auVar29,in_XMM6,0x30);
          auVar28 = auVar87._0_12_;
          in_XMM14 = insertps(auVar86,ZEXT416((uint)(fVar24 * fVar62)),0x30);
          in_XMM3 = ZEXT416((uint)(fVar27 * fVar62));
          auVar55._0_4_ = fVar62 * fVar49;
          auVar53 = auVar55._0_12_;
          auVar37 = insertps(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                             *(undefined4 *)(lVar12 + 4 + lVar15),0x10);
          auVar87 = insertps(auVar21,auVar55,0x30);
          auVar21 = insertps(auVar37,*(undefined4 *)(lVar12 + 0x3c + lVar15),0x20);
          auVar21 = insertps(auVar21,in_XMM3,0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar12 = *plVar8;
          lVar15 = plVar8[2] * uVar11;
          in_XMM14 = *(undefined1 (*) [16])(lVar12 + lVar15);
          auVar21 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar15);
          auVar87 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar15);
          auVar28 = SUB1612(*(undefined1 (*) [16])(lVar12 + 0x30 + lVar15),0);
        }
        lVar12 = (ulong)(uVar13 + 1) * 0x38;
        plVar8 = (long *)(lVar9 + lVar12);
        iVar5 = *(int *)(lVar9 + 0x20 + lVar12);
        if (iVar5 == 0x9134) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          auVar37 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x10 + lVar12),0x1c);
          in_XMM4 = insertps(auVar37,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
          auVar37 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
          in_XMM6 = insertps(auVar37,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
          auVar37 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                             *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
          in_XMM3 = insertps(auVar37,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
          auVar37 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                             *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
          auVar37 = insertps(auVar37,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
          auVar53 = auVar37._0_12_;
        }
        else if (iVar5 == 0x9234) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          uVar2 = *(undefined8 *)(lVar9 + 4 + lVar12);
          in_XMM4._4_4_ = (int)uVar2;
          in_XMM4._0_4_ = *(undefined4 *)(lVar9 + lVar12);
          in_XMM4._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
          in_XMM6._4_4_ = (int)uVar2;
          in_XMM6._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar12);
          in_XMM6._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM6._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
          in_XMM3._4_4_ = (int)uVar2;
          in_XMM3._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
          in_XMM3._8_4_ = (int)((ulong)uVar2 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
          auVar53._4_4_ = (int)uVar2;
          auVar53._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar12);
          auVar53._8_4_ = (int)((ulong)uVar2 >> 0x20);
        }
        else if (iVar5 == 0xb001) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
          auVar37 = insertps(auVar34,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
          uVar2 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
          auVar39._4_4_ = (int)uVar2;
          auVar39._0_4_ = *(undefined4 *)(lVar9 + lVar12);
          auVar39._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar39._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
          auVar56._4_4_ = (int)uVar2;
          auVar56._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
          auVar56._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar56._12_4_ = 0;
          fVar43 = *(float *)(lVar9 + 0x24 + lVar12);
          fVar24 = *(float *)(lVar9 + 0x28 + lVar12);
          fVar27 = *(float *)(lVar9 + 0x2c + lVar12);
          fVar49 = *(float *)(lVar9 + 0x30 + lVar12);
          fVar77 = fVar49 * fVar49 + fVar27 * fVar27 + fVar43 * fVar43 + fVar24 * fVar24;
          auVar75 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar62 = auVar75._0_4_;
          auVar76._4_12_ = auVar75._4_12_;
          fVar62 = fVar62 * fVar62 * fVar77 * -0.5 * fVar62 + fVar62 * 1.5;
          auVar75 = insertps(auVar56,ZEXT416((uint)(fVar43 * fVar62)),0x30);
          auVar53 = auVar75._0_12_;
          in_XMM4 = insertps(auVar39,ZEXT416((uint)(fVar24 * fVar62)),0x30);
          auVar76._0_4_ = fVar62 * fVar49;
          auVar75 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                             *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
          in_XMM3 = insertps(auVar37,auVar76,0x30);
          auVar37 = insertps(auVar75,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
          in_XMM6 = insertps(auVar37,ZEXT416((uint)(fVar27 * fVar62)),0x30);
        }
        else if (iVar5 == 0x9244) {
          lVar9 = *plVar8;
          lVar12 = uVar11 * plVar8[2];
          in_XMM4 = *(undefined1 (*) [16])(lVar9 + lVar12);
          in_XMM6 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
          in_XMM3 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
          auVar53 = SUB1612(*(undefined1 (*) [16])(lVar9 + 0x30 + lVar12),0);
        }
        fVar43 = 1.0 - fVar23;
        fVar24 = in_XMM14._4_4_;
        fVar27 = in_XMM14._8_4_;
        fVar49 = in_XMM14._12_4_;
        in_XMM14._0_4_ = in_XMM14._0_4_ * fVar43 + in_XMM4._0_4_ * fVar23;
        in_XMM14._4_4_ = fVar24 * fVar43 + in_XMM4._4_4_ * fVar23;
        in_XMM14._8_4_ = fVar27 * fVar43 + in_XMM4._8_4_ * fVar23;
        in_XMM14._12_4_ = fVar49 * fVar43 + in_XMM4._12_4_ * fVar23;
        in_XMM1._0_4_ = auVar21._0_4_ * fVar43 + in_XMM6._0_4_ * fVar23;
        in_XMM1._4_4_ = auVar21._4_4_ * fVar43 + in_XMM6._4_4_ * fVar23;
        in_XMM1._8_4_ = auVar21._8_4_ * fVar43 + in_XMM6._8_4_ * fVar23;
        in_XMM1._12_4_ = auVar21._12_4_ * fVar43 + in_XMM6._12_4_ * fVar23;
        in_XMM0._0_4_ = auVar87._0_4_ * fVar43 + in_XMM3._0_4_ * fVar23;
        in_XMM0._4_4_ = auVar87._4_4_ * fVar43 + in_XMM3._4_4_ * fVar23;
        in_XMM0._8_4_ = auVar87._8_4_ * fVar43 + in_XMM3._8_4_ * fVar23;
        in_XMM0._12_4_ = auVar87._12_4_ * fVar43 + in_XMM3._12_4_ * fVar23;
        auVar44._0_4_ = fVar43 * auVar28._0_4_ + fVar23 * auVar53._0_4_;
        auVar44._4_4_ = fVar43 * auVar28._4_4_ + fVar23 * auVar53._4_4_;
        auVar44._8_4_ = fVar43 * auVar28._8_4_ + fVar23 * auVar53._8_4_;
      }
    }
    fVar43 = in_XMM0._0_4_;
    fVar23 = in_XMM0._4_4_;
    fVar24 = in_XMM0._8_4_;
    fVar27 = in_XMM0._12_4_;
    fVar49 = in_XMM1._0_4_;
    fVar62 = in_XMM1._4_4_;
    fVar77 = in_XMM1._8_4_;
    auVar30._0_4_ = fVar49 * fVar23 - fVar43 * fVar62;
    fVar32 = fVar62 * fVar24 - fVar23 * fVar77;
    fVar33 = fVar77 * fVar43 - fVar24 * fVar49;
    auVar35._4_4_ = fVar33;
    auVar35._0_4_ = fVar32;
    auVar35._8_4_ = auVar30._0_4_;
    auVar35._12_4_ = in_XMM1._12_4_ * fVar27 - fVar27 * in_XMM1._12_4_;
    fVar51 = in_XMM14._0_4_;
    fVar70 = in_XMM14._4_4_;
    fVar78 = in_XMM14._8_4_;
    auVar20._0_4_ = fVar43 * fVar70 - fVar23 * fVar51;
    auVar20._4_4_ = fVar23 * fVar78 - fVar24 * fVar70;
    auVar20._8_4_ = fVar24 * fVar51 - fVar43 * fVar78;
    auVar20._12_4_ = fVar27 * in_XMM14._12_4_ - fVar27 * in_XMM14._12_4_;
    auVar87 = dpps(in_XMM14,auVar35,0x7f);
    fVar43 = fVar77 * fVar70 - fVar78 * fVar62;
    auVar26._4_4_ = fVar43;
    auVar26._0_4_ = fVar32;
    auVar21 = insertps(auVar20,auVar20,0x4a);
    auVar30._4_4_ = auVar20._0_4_;
    auVar30._8_4_ = fVar62 * fVar51 - fVar70 * fVar49;
    auVar30._12_4_ = 0;
    auVar26._8_4_ = fVar43;
    auVar26._12_4_ = auVar21._4_4_;
    auVar25._8_8_ = auVar26._8_8_;
    auVar25._4_4_ = auVar21._0_4_;
    auVar25._0_4_ = fVar32;
    auVar36._4_4_ = auVar21._8_4_;
    auVar36._0_4_ = fVar33;
    auVar36._8_4_ = fVar49 * fVar78 - fVar51 * fVar77;
    auVar36._12_4_ = auVar21._12_4_;
    auVar88._0_4_ = auVar87._0_4_;
    auVar88._4_4_ = auVar88._0_4_;
    auVar88._8_4_ = auVar88._0_4_;
    auVar88._12_4_ = auVar88._0_4_;
    auVar21 = divps(auVar25,auVar88);
    auVar37 = divps(auVar36,auVar88);
    auVar87 = divps(auVar30,auVar88);
    fVar68 = auVar44._0_4_;
    fVar52 = auVar44._4_4_;
    fVar60 = auVar44._8_4_;
    fVar49 = auVar87._0_4_;
    fVar62 = auVar87._4_4_;
    fVar77 = auVar87._8_4_;
    fVar32 = auVar87._12_4_;
    fVar33 = auVar37._0_4_;
    fVar51 = auVar37._4_4_;
    fVar70 = auVar37._8_4_;
    fVar78 = auVar37._12_4_;
    fVar43 = auVar21._0_4_;
    fVar23 = auVar21._4_4_;
    fVar24 = auVar21._8_4_;
    fVar27 = auVar21._12_4_;
    aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
    fVar50 = aVar3.x;
    fVar59 = aVar3.y;
    fVar61 = aVar3.z;
    aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar63 = aVar4.x;
    fVar66 = aVar4.y;
    fVar67 = aVar4.z;
    auVar40._0_4_ =
         fVar50 * fVar43 +
         fVar59 * fVar33 + (fVar61 * fVar49 - (fVar68 * fVar43 + fVar52 * fVar33 + fVar60 * fVar49))
    ;
    auVar40._4_4_ =
         fVar50 * fVar23 +
         fVar59 * fVar51 + (fVar61 * fVar62 - (fVar68 * fVar23 + fVar52 * fVar51 + fVar60 * fVar62))
    ;
    auVar40._8_4_ =
         fVar50 * fVar24 +
         fVar59 * fVar70 + (fVar61 * fVar77 - (fVar68 * fVar24 + fVar52 * fVar70 + fVar60 * fVar77))
    ;
    auVar40._12_4_ =
         fVar50 * fVar27 +
         fVar59 * fVar78 + (fVar61 * fVar32 - (fVar68 * fVar27 + fVar52 * fVar78 + fVar60 * fVar32))
    ;
    aVar41.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar40,aVar3,8);
    (ray->super_RayK<1>).org.field_0 = aVar41;
    auVar22._0_4_ = fVar63 * fVar43 + fVar66 * fVar33 + fVar67 * fVar49;
    auVar22._4_4_ = fVar63 * fVar23 + fVar66 * fVar51 + fVar67 * fVar62;
    auVar22._8_4_ = fVar63 * fVar24 + fVar66 * fVar70 + fVar67 * fVar77;
    auVar22._12_4_ = fVar63 * fVar27 + fVar66 * fVar78 + fVar67 * fVar32;
    aVar41.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar22,aVar4,8);
    (ray->super_RayK<1>).dir.field_0 = aVar41;
    (**(code **)(p_Var16 + 0x78))(p_Var16 + 0x58,ray);
    local_188 = aVar3._0_8_;
    uStack_180 = aVar3._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_188;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_180;
    local_178 = aVar4._0_8_;
    uStack_170 = aVar4._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_178;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_170;
    pRVar7->instID[0] = 0xffffffff;
    pRVar7->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1MB::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }